

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

uint UFPC::Merge(uint i,uint j)

{
  uint uVar1;
  uint t_1;
  uint t;
  uint root_j;
  uint root;
  uint j_local;
  uint i_local;
  
  for (t = i; P_[t] < t; t = P_[t]) {
  }
  t_1 = j;
  root = i;
  if (i != j) {
    for (; P_[t_1] < t_1; t_1 = P_[t_1]) {
    }
    root_j = j;
    if (t_1 < t) {
      t = t_1;
    }
    while (P_[root_j] < root_j) {
      uVar1 = P_[root_j];
      P_[root_j] = t;
      root_j = uVar1;
    }
    P_[root_j] = t;
  }
  while (P_[root] < root) {
    uVar1 = P_[root];
    P_[root] = t;
    root = uVar1;
  }
  P_[root] = t;
  return t;
}

Assistant:

static unsigned Merge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        unsigned root(i);
        while (P_[root] < root) {
            root = P_[root];
        }
        if (i != j) {
            // FindRoot(j)
            unsigned root_j(j);
            while (P_[root_j] < root_j) {
                root_j = P_[root_j];
            }
            if (root > root_j) {
                root = root_j;
            }
            // SetRoot(j, root);
            while (P_[j] < j) {
                unsigned t = P_[j];
                P_[j] = root;
                j = t;
            }
            P_[j] = root;
        }
        // SetRoot(i, root);
        while (P_[i] < i) {
            unsigned t = P_[i];
            P_[i] = root;
            i = t;
        }
        P_[i] = root;
        return root;
    }